

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

bool __thiscall
tinyobj::ObjReader::ParseFromFile(ObjReader *this,string *filename,ObjReaderConfig *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ObjReader OVar2;
  long lVar3;
  string mtl_search_path;
  long *local_50 [2];
  long local_40 [2];
  
  paVar1 = &mtl_search_path.field_2;
  mtl_search_path._M_string_length = 0;
  mtl_search_path.field_2._M_local_buf[0] = '\0';
  mtl_search_path._M_dataplus._M_p = (pointer)paVar1;
  if (*(long *)(config + 0x10) == 0) {
    lVar3 = std::__cxx11::string::find_last_of((char *)filename,0x98152d,0xffffffffffffffff);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)filename);
      std::__cxx11::string::operator=((string *)&mtl_search_path,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&mtl_search_path);
  }
  OVar2 = (ObjReader)
          LoadObj((attrib_t *)(this + 8),
                  (vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)(this + 0x98),
                  (vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)(this + 0xb0)
                  ,(string *)(this + 200),(string *)(this + 0xe8),(filename->_M_dataplus)._M_p,
                  mtl_search_path._M_dataplus._M_p,(bool)*config,(bool)config[1]);
  *this = OVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mtl_search_path._M_dataplus._M_p != paVar1) {
    operator_delete(mtl_search_path._M_dataplus._M_p,
                    CONCAT71(mtl_search_path.field_2._M_allocated_capacity._1_7_,
                             mtl_search_path.field_2._M_local_buf[0]) + 1);
  }
  return (bool)OVar2;
}

Assistant:

bool ObjReader::ParseFromFile(const std::string &filename,
                              const ObjReaderConfig &config) {
  std::string mtl_search_path;

  if (config.mtl_search_path.empty()) {
    //
    // split at last '/'(for unixish system) or '\\'(for windows) to get
    // the base directory of .obj file
    //
    size_t pos = filename.find_last_of("/\\");
    if (pos != std::string::npos) {
      mtl_search_path = filename.substr(0, pos);
    }
  } else {
    mtl_search_path = config.mtl_search_path;
  }

  valid_ = LoadObj(&attrib_, &shapes_, &materials_, &warning_, &error_,
                   filename.c_str(), mtl_search_path.c_str(),
                   config.triangulate, config.vertex_color);

  return valid_;
}